

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

void __thiscall
SQCompilation::SQParser::ParseTableOrClass
          (SQParser *this,TableDecl *decl,SQInteger separator,SQInteger terminator)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  SQParser *in_RDI;
  bool bVar2;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  Id *in_stack_00000008;
  SQParser *in_stack_00000010;
  Expr *expr_1;
  LiteralExpr *key_3;
  Id *id;
  Expr *expr;
  LiteralExpr *key_2;
  Expr *value;
  Expr *key_1;
  DeclExpr *e;
  FunctionDecl *f;
  LiteralExpr *key;
  Id *funcName;
  SQInteger c_1;
  SQInteger l_1;
  SQInteger tk;
  uint flags;
  SQInteger c;
  SQInteger l;
  NewObjectType otype;
  NestingChecker nc;
  SQParser *in_stack_fffffffffffffe78;
  NestingChecker *in_stack_fffffffffffffe80;
  DeclExpr *in_stack_fffffffffffffe88;
  SQParser *in_stack_fffffffffffffe90;
  FunctionDecl *in_stack_fffffffffffffe98;
  SQParser *in_stack_fffffffffffffea0;
  DeclExpr *in_stack_fffffffffffffec8;
  SQParser *in_stack_fffffffffffffed0;
  Id *local_110;
  Expr *in_stack_ffffffffffffff48;
  SQExpressionContext expression_context;
  SQParser *in_stack_ffffffffffffff50;
  NestingChecker local_30;
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  NestingChecker::NestingChecker(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  bVar2 = local_18 != 0x2c;
  do {
    if (in_RDI->_token == local_20) {
      Lex(in_stack_fffffffffffffe90);
      NestingChecker::~NestingChecker(&local_30);
      return;
    }
    line(in_RDI);
    column(in_RDI);
    if ((bVar2) && (in_RDI->_token == 0x142)) {
      Lex(in_stack_fffffffffffffe90);
    }
    expression_context = (SQExpressionContext)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    lVar1 = in_RDI->_token;
    if (lVar1 == 0x5b) {
      Lex(in_stack_fffffffffffffe90);
      Expression(in_stack_ffffffffffffff50,
                 (SQExpressionContext)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      Expression(in_stack_ffffffffffffff50,
                 (SQExpressionContext)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      TableDecl::addMember
                ((TableDecl *)in_stack_fffffffffffffea0,(Expr *)in_stack_fffffffffffffe98,
                 (Expr *)in_stack_fffffffffffffe90,(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20))
      ;
    }
    else if (lVar1 == 0x103) {
      if (bVar2) goto LAB_001bc22b;
      in_stack_ffffffffffffff50 =
           (SQParser *)Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      in_stack_ffffffffffffff48 = Expression(in_stack_ffffffffffffff50,expression_context);
      TableDecl::addMember
                ((TableDecl *)in_stack_fffffffffffffea0,(Expr *)in_stack_fffffffffffffe98,
                 (Expr *)in_stack_fffffffffffffe90,(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20))
      ;
    }
    else if ((lVar1 == 0x11d) || (lVar1 == 0x136)) {
      lVar1 = in_RDI->_token;
      line(in_RDI);
      column(in_RDI);
      Lex(in_stack_fffffffffffffe90);
      if (lVar1 == 0x11d) {
        local_110 = (Id *)Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      }
      else {
        local_110 = newNode<SQCompilation::Id,char_const*>
                              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
      }
      Id::id(local_110);
      newNode<SQCompilation::LiteralExpr,char_const*>
                (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
      setCoordinates<SQCompilation::LiteralExpr>
                (in_stack_fffffffffffffe90,(LiteralExpr *)in_stack_fffffffffffffe88,
                 (SQInteger)in_stack_fffffffffffffe80,(SQInteger)in_stack_fffffffffffffe78);
      Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffed0 =
           (SQParser *)
           CreateFunction(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00,
                          (bool)unaff_retaddr);
      in_stack_fffffffffffffec8 =
           newNode<SQCompilation::DeclExpr,SQCompilation::FunctionDecl*>
                     (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      setCoordinates<SQCompilation::DeclExpr>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (SQInteger)in_stack_fffffffffffffe80,(SQInteger)in_stack_fffffffffffffe78);
      TableDecl::addMember
                ((TableDecl *)in_stack_fffffffffffffea0,(Expr *)in_stack_fffffffffffffe98,
                 (Expr *)in_stack_fffffffffffffe90,(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20))
      ;
    }
    else {
LAB_001bc22b:
      in_stack_fffffffffffffea0 =
           (SQParser *)Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffe98 =
           (FunctionDecl *)
           setCoordinates<SQCompilation::Expr>
                     (in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->super_Expr,
                      (SQInteger)in_stack_fffffffffffffe80,(SQInteger)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe90 = (SQParser *)Id::id((Id *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffe88 =
           (DeclExpr *)
           newNode<SQCompilation::LiteralExpr,char_const*>
                     (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
      copyCoordinates<SQCompilation::LiteralExpr>
                (in_stack_fffffffffffffea0,(Node *)in_stack_fffffffffffffe98,
                 (LiteralExpr *)in_stack_fffffffffffffe90);
      if ((bVar2) ||
         ((((in_RDI->_token != 0x102 && (in_RDI->_token != local_18)) &&
           (in_RDI->_token != local_20)) && ((in_RDI->_token != 0x5b && (in_RDI->_token != 0x11d))))
         )) {
        Expect(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
        in_stack_fffffffffffffe80 =
             (NestingChecker *)
             Expression(in_stack_ffffffffffffff50,
                        (SQExpressionContext)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        TableDecl::addMember
                  ((TableDecl *)in_stack_fffffffffffffea0,(Expr *)in_stack_fffffffffffffe98,
                   (Expr *)in_stack_fffffffffffffe90,
                   (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      }
      else {
        TableDecl::addMember
                  ((TableDecl *)in_stack_fffffffffffffea0,(Expr *)in_stack_fffffffffffffe98,
                   (Expr *)in_stack_fffffffffffffe90,
                   (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      }
    }
    if (in_RDI->_token == local_18) {
      Lex(in_stack_fffffffffffffe90);
    }
  } while( true );
}

Assistant:

void SQParser::ParseTableOrClass(TableDecl *decl, SQInteger separator, SQInteger terminator)
{
    NestingChecker nc(this);
    NewObjectType otype = separator==_SC(',') ? NOT_TABLE : NOT_CLASS;

    while(_token != terminator) {
        SQInteger l = line();
        SQInteger c = column();
        unsigned flags = 0;
        //check if is an static
        if(otype == NOT_CLASS) {
            if(_token == TK_STATIC) {
                flags |= TMF_STATIC;
                Lex();
            }
        }

        switch (_token) {
        case TK_FUNCTION:
        case TK_CONSTRUCTOR: {
            SQInteger tk = _token;
            SQInteger l = line(), c = column();
            Lex();
            Id *funcName = tk == TK_FUNCTION ? (Id *)Expect(TK_IDENTIFIER) : newNode<Id>(_SC("constructor"));
            assert(funcName);
            LiteralExpr *key = newNode<LiteralExpr>(funcName->id()); //-V522
            setCoordinates(key, l, c);
            Expect(_SC('('));
            FunctionDecl *f = CreateFunction(funcName, false, tk == TK_CONSTRUCTOR);
            DeclExpr *e = newNode<DeclExpr>(f);
            setCoordinates(e, l, c);
            decl->addMember(key, e, flags);
        }
        break;
        case _SC('['): {
            Lex();

            Expr *key = Expression(SQE_RVALUE); //-V522
            assert(key);
            Expect(_SC(']'));
            Expect(_SC('='));
            Expr *value = Expression(SQE_RVALUE);
            decl->addMember(key, value, flags | TMF_DYNAMIC_KEY);
            break;
        }
        case TK_STRING_LITERAL: //JSON
            if (otype == NOT_TABLE) { //only works for tables
                LiteralExpr *key = (LiteralExpr *)Expect(TK_STRING_LITERAL);  //-V522
                assert(key);
                Expect(_SC(':'));
                Expr *expr = Expression(SQE_RVALUE);
                decl->addMember(key, expr, flags | TMF_JSON);
                break;
            }  //-V796
        default: {
            Id *id = (Id *)setCoordinates(Expect(TK_IDENTIFIER), l, c);
            assert(id);
            LiteralExpr *key = newNode<LiteralExpr>(id->id()); //-V522
            copyCoordinates(id, key);
            if ((otype == NOT_TABLE) &&
                (_token == TK_IDENTIFIER || _token == separator || _token == terminator || _token == _SC('[')
                    || _token == TK_FUNCTION)) {
                decl->addMember(key, id, flags);
            }
            else {
                Expect(_SC('='));
                Expr *expr = Expression(SQE_RVALUE);
                decl->addMember(key, expr, flags);
            }
        }
        }
        if (_token == separator) Lex(); //optional comma/semicolon
    }

    Lex();
}